

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicsObject.cpp
# Opt level: O2

uint32 Js::AtomicsObject::ValidateAtomicAccess
                 (Var typedArray,Var requestIndex,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  TypedArrayBase *pTVar6;
  double dVar7;
  
  bVar2 = VarIs<Js::TypedArrayBase>(typedArray);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                ,0x38,"(VarIs<TypedArrayBase>(typedArray))",
                                "VarIs<TypedArrayBase>(typedArray)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar2 = TaggedInt::Is(requestIndex);
  if (bVar2) {
    uVar3 = TaggedInt::ToInt32(requestIndex);
LAB_00a03814:
    if ((int)uVar3 < 0) goto LAB_00a03833;
  }
  else {
    BVar4 = JavascriptOperators::IsUndefined(requestIndex);
    uVar3 = 0;
    if (BVar4 == 0) {
      uVar3 = JavascriptConversion::ToInt32_Full(requestIndex,scriptContext);
      dVar7 = JavascriptConversion::ToInteger(requestIndex,scriptContext);
      if ((dVar7 != (double)(int)uVar3) || (NAN(dVar7) || NAN((double)(int)uVar3)))
      goto LAB_00a03833;
      goto LAB_00a03814;
    }
  }
  pTVar6 = VarTo<Js::TypedArrayBase>(typedArray);
  if ((int)uVar3 < (int)(pTVar6->super_ArrayBufferParent).super_ArrayObject.length) {
    return uVar3;
  }
LAB_00a03833:
  JavascriptError::ThrowRangeError(scriptContext,-0x7ff5e9e1,(PCWSTR)0x0);
}

Assistant:

uint32 AtomicsObject::ValidateAtomicAccess(Var typedArray, Var requestIndex, ScriptContext *scriptContext)
    {
        Assert(VarIs<TypedArrayBase>(typedArray));

        int32 accessIndex = -1;
        if (TaggedInt::Is(requestIndex))
        {
            accessIndex = TaggedInt::ToInt32(requestIndex);
        }
        else if(Js::JavascriptOperators::IsUndefined(requestIndex))
        {
            accessIndex = 0;
        }
        else
        {
            accessIndex = JavascriptConversion::ToInt32_Full(requestIndex, scriptContext);
            double dblValue = JavascriptConversion::ToInteger(requestIndex, scriptContext);
            if (dblValue != accessIndex)
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_InvalidTypedArrayIndex);
            }
        }

        if (accessIndex < 0 || accessIndex >= (int32)VarTo<TypedArrayBase>(typedArray)->GetLength())
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_InvalidTypedArrayIndex);
        }

        return (uint32)accessIndex;
    }